

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t hd_strlcpy(char *dst,char *src,size_t siz)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *s;
  long lVar5;
  bool bVar6;
  
  bVar2 = true;
  pcVar3 = src;
  if (1 < siz) {
    lVar5 = siz - 2;
    do {
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      *dst = cVar1;
      dst = dst + 1;
      bVar6 = lVar5 != 0;
      lVar5 = lVar5 + -1;
      bVar2 = cVar1 != '\0';
      if (cVar1 == '\0') break;
    } while (bVar6);
  }
  if (bVar2) {
    pcVar4 = pcVar3;
    if (siz != 0) {
      *dst = '\0';
    }
    do {
      pcVar3 = pcVar4 + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar3;
    } while (cVar1 != '\0');
  }
  return (size_t)(pcVar3 + ~(ulong)src);
}

Assistant:

size_t
hd_strlcpy(char *dst, const char *src, size_t siz)
{
    register char *d = dst;
    register const char *s = src;
    register size_t n = siz;

    /* Copy as many bytes as will fit */
    if (n != 0 && --n != 0) {
        do {
            if ((*d++ = *s++) == 0)
                break;
        } while (--n != 0);
    }

    /* Not enough room in dst, add NUL and traverse rest of src */
    if (n == 0) {
        if (siz != 0)
            *d = '\0';		/* NUL-terminate dst */
        while (*s++)
            ;
    }

    return(s - src - 1);	/* count does not include NUL */
}